

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.cpp
# Opt level: O3

unique_ptr<Catch::IStream> __thiscall Catch::makeStream(Catch *this,string *filename)

{
  byte *pbVar1;
  int iVar2;
  streambuf *psVar3;
  undefined8 *puVar4;
  long *this_00;
  string local_50;
  ReusableStringStream local_30;
  
  if ((filename->_M_string_length != 0) &&
     (iVar2 = std::__cxx11::string::compare((char *)filename), iVar2 != 0)) {
    if (*(filename->_M_dataplus)._M_p != '%') {
      puVar4 = (undefined8 *)operator_new(0x208);
      *puVar4 = &PTR__FileStream_00243c50;
      this_00 = puVar4 + 1;
      std::ofstream::ofstream(this_00);
      std::ofstream::open((char *)this_00,(_Ios_Openmode)(filename->_M_dataplus)._M_p);
      if ((*(byte *)((long)puVar4 + *(long *)(*this_00 + -0x18) + 0x28) & 5) == 0) {
        pbVar1 = (byte *)((long)puVar4 + *(long *)(*this_00 + -0x18) + 0x21);
        *pbVar1 = *pbVar1 | 0x20;
        *(undefined8 **)this = puVar4;
        Detail::unique_ptr<Catch::Detail::(anonymous_namespace)::FileStream>::~unique_ptr
                  ((unique_ptr<Catch::Detail::(anonymous_namespace)::FileStream> *)0x0);
        return (unique_ptr<Catch::IStream>)(IStream *)this;
      }
      ReusableStringStream::ReusableStringStream(&local_30);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_30.m_oss,"Unable to open file: \'",0x16);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_30.m_oss,(filename->_M_dataplus)._M_p,filename->_M_string_length);
      local_50._M_dataplus._M_p._0_1_ = 0x27;
      std::__ostream_insert<char,std::char_traits<char>>(local_30.m_oss,(char *)&local_50,1);
      std::__cxx11::stringbuf::str();
      throw_domain_error(&local_50);
    }
    iVar2 = std::__cxx11::string::compare((char *)filename);
    if (iVar2 == 0) {
      puVar4 = (undefined8 *)operator_new(0x120);
      *puVar4 = &PTR__DebugOutStream_00243b28;
      psVar3 = (streambuf *)operator_new(0x148);
      *(code **)psVar3 = sysconf;
      *(undefined8 *)(psVar3 + 8) = 0;
      *(undefined8 *)(psVar3 + 0x10) = 0;
      *(undefined8 *)(psVar3 + 0x18) = 0;
      *(undefined8 *)(psVar3 + 0x20) = 0;
      *(undefined8 *)(psVar3 + 0x28) = 0;
      *(undefined8 *)(psVar3 + 0x30) = 0;
      std::locale::locale((locale *)(psVar3 + 0x38));
      *(undefined ***)psVar3 = &PTR__StreamBufImpl_00243b70;
      *(streambuf **)(psVar3 + 0x28) = psVar3 + 0x40;
      *(streambuf **)(psVar3 + 0x20) = psVar3 + 0x40;
      *(streambuf **)(psVar3 + 0x30) = psVar3 + 0x140;
      puVar4[1] = psVar3;
      std::ostream::ostream(puVar4 + 2,psVar3);
      *(undefined8 **)this = puVar4;
      Detail::unique_ptr<Catch::Detail::(anonymous_namespace)::DebugOutStream>::~unique_ptr
                ((unique_ptr<Catch::Detail::(anonymous_namespace)::DebugOutStream> *)0x0);
      return (unique_ptr<Catch::IStream>)(IStream *)this;
    }
    iVar2 = std::__cxx11::string::compare((char *)filename);
    if (iVar2 == 0) {
      puVar4 = (undefined8 *)operator_new(0x118);
      *puVar4 = &PTR__CerrStream_00243c08;
      std::ostream::ostream(puVar4 + 1,*(streambuf **)(*(long *)(std::cerr + -0x18) + 0x248770));
      *(undefined8 **)this = puVar4;
      return (unique_ptr<Catch::IStream>)(IStream *)this;
    }
    iVar2 = std::__cxx11::string::compare((char *)filename);
    if (iVar2 != 0) {
      ReusableStringStream::ReusableStringStream(&local_30);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_30.m_oss,"Unrecognised stream: \'",0x16);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_30.m_oss,(filename->_M_dataplus)._M_p,filename->_M_string_length);
      local_50._M_dataplus._M_p._0_1_ = 0x27;
      std::__ostream_insert<char,std::char_traits<char>>(local_30.m_oss,(char *)&local_50,1);
      std::__cxx11::stringbuf::str();
      throw_domain_error(&local_50);
    }
  }
  Detail::make_unique<Catch::Detail::(anonymous_namespace)::CoutStream>();
  *(ulong *)this = CONCAT71(local_50._M_dataplus._M_p._1_7_,local_50._M_dataplus._M_p._0_1_);
  Detail::unique_ptr<Catch::Detail::(anonymous_namespace)::CoutStream>::~unique_ptr
            ((unique_ptr<Catch::Detail::(anonymous_namespace)::CoutStream> *)0x0);
  return (unique_ptr<Catch::IStream>)(IStream *)this;
}

Assistant:

auto makeStream( std::string const& filename ) -> Detail::unique_ptr<IStream> {
        if ( filename.empty() || filename == "-" ) {
            return Detail::make_unique<Detail::CoutStream>();
        }
        if( filename[0] == '%' ) {
            if ( filename == "%debug" ) {
                return Detail::make_unique<Detail::DebugOutStream>();
            } else if ( filename == "%stderr" ) {
                return Detail::make_unique<Detail::CerrStream>();
            } else if ( filename == "%stdout" ) {
                return Detail::make_unique<Detail::CoutStream>();
            } else {
                CATCH_ERROR( "Unrecognised stream: '" << filename << '\'' );
            }
        }
        return Detail::make_unique<Detail::FileStream>( filename );
    }